

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::GenerateDynamicInterpreterThunk(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  JavascriptMethod p_Var5;
  ScriptContext *this_00;
  ThreadContext *this_01;
  FunctionBody *this_local;
  
  if (((*(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 0xb & 1)
       != 0) && (uVar3 = GetByteCodeCount(this), uVar3 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xeeb,"(!m_isWasmFunction || GetByteCodeCount() > 0)",
                                "The wasm function should have been parsed before generating the dynamic interpreter thunk"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk == (Type)0x0) {
    if ((*(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 10 & 1)
        == 0) {
      p_Var5 = ScriptContext::GetNextDynamicInterpreterThunk
                         ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,
                          &(this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk);
      FunctionProxy::SetOriginalEntryPoint((FunctionProxy *)this,p_Var5);
    }
    else {
      p_Var5 = ScriptContext::GetNextDynamicAsmJsInterpreterThunk
                         ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,
                          &(this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk);
      FunctionProxy::SetOriginalEntryPoint((FunctionProxy *)this,p_Var5);
    }
  }
  else {
    p_Var5 = (JavascriptMethod)
             InterpreterThunkEmitter::ConvertToEntryPoint
                       ((this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk);
    FunctionProxy::SetOriginalEntryPoint((FunctionProxy *)this,p_Var5);
  }
  this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
  this_01 = ScriptContext::GetThreadContext(this_00);
  bVar2 = ThreadContext::NoDynamicThunks(this_01);
  if (bVar2) {
    if ((this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf07,"(this->m_dynamicInterpreterThunk == nullptr)",
                                  "this->m_dynamicInterpreterThunk == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if ((*(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 10 & 1)
        == 0) {
      p_Var5 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
      if (p_Var5 != InterpreterStackFrame::StaticInterpreterThunk) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xf0f,
                                    "(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk)"
                                    ,
                                    "this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    else {
      p_Var5 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
      if (p_Var5 != InterpreterStackFrame::StaticInterpreterAsmThunk) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xf0b,
                                    "(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk)"
                                    ,
                                    "this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  return;
}

Assistant:

void FunctionBody::GenerateDynamicInterpreterThunk()
    {
        AssertOrFailFastMsg(!m_isWasmFunction || GetByteCodeCount() > 0, "The wasm function should have been parsed before generating the dynamic interpreter thunk");

        if (this->m_dynamicInterpreterThunk == nullptr)
        {
            // NOTE: Etw rundown thread may be reading this->dynamicInterpreterThunk concurrently. We don't need to synchronize
            // access as it is ok for etw rundown to get either null or updated new value.

            if (m_isAsmJsFunction)
            {
                this->SetOriginalEntryPoint(this->m_scriptContext->GetNextDynamicAsmJsInterpreterThunk(&this->m_dynamicInterpreterThunk));
            }
            else
            {
                this->SetOriginalEntryPoint(this->m_scriptContext->GetNextDynamicInterpreterThunk(&this->m_dynamicInterpreterThunk));
            }
            if (this->m_dynamicInterpreterThunk != nullptr)
            {
                JS_ETW(EtwTrace::LogMethodInterpreterThunkLoadEvent(this));
            }
        }
        else
        {
            this->SetOriginalEntryPoint((JavascriptMethod)InterpreterThunkEmitter::ConvertToEntryPoint(this->m_dynamicInterpreterThunk));
        }

#if DBG
        if (GetScriptContext()->GetThreadContext()->NoDynamicThunks())
        {
            Assert(this->m_dynamicInterpreterThunk == nullptr);
#ifdef ASMJS_PLAT
            if (m_isAsmJsFunction)
            {
                Assert(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterAsmThunk);
            }
            else
            {
                Assert(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk);
            }
#else
            Assert(this->GetOriginalEntryPoint_Unchecked() == (JavascriptMethod)&Js::InterpreterStackFrame::StaticInterpreterThunk);
#endif
        }
#endif
    }